

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh4asm_txt_emit.h
# Opt level: O0

char * sh4asm_disp4_str(uint disp4,uint shift)

{
  uint shift_local;
  uint disp4_local;
  
  snprintf(sh4asm_disp4_str::buf,8,"%d",
           (ulong)(disp4 & (0x10 << ((byte)shift & 0x1f)) - 1U &
                  ((1 << ((byte)shift & 0x1f)) - 1U ^ 0xffffffff)));
  sh4asm_disp4_str::buf[7] = '\0';
  return sh4asm_disp4_str::buf;
}

Assistant:

static char const *sh4asm_disp4_str(unsigned disp4, unsigned shift) {
    // convert to hex
    static char buf[8];
    snprintf(buf, sizeof(buf), "%d", //"0x%x",
             disp4 & ((16 << shift) - 1) & ~((1 << shift)-1));
    buf[7] = '\0';
    return buf;
}